

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

ASN1_OCTET_STRING * a2i_IPADDRESS_NC(char *ipasc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *ipasc_00;
  ASN1_OCTET_STRING *str;
  uchar ipout [32];
  uint8_t auStack_48 [40];
  
  pcVar4 = strchr(ipasc,0x2f);
  if (pcVar4 == (char *)0x0) {
    return (ASN1_OCTET_STRING *)0x0;
  }
  ipasc_00 = OPENSSL_strdup(ipasc);
  if (ipasc_00 == (char *)0x0) {
    return (ASN1_OCTET_STRING *)0x0;
  }
  ipasc_00[(long)pcVar4 - (long)ipasc] = '\0';
  uVar1 = x509v3_a2i_ipadd(auStack_48,ipasc_00);
  if (uVar1 != 0) {
    uVar2 = x509v3_a2i_ipadd(auStack_48 + uVar1,ipasc_00 + ((long)pcVar4 - (long)ipasc) + 1);
    OPENSSL_free(ipasc_00);
    if ((uVar1 == uVar2) && (str = ASN1_OCTET_STRING_new(), str != (ASN1_OCTET_STRING *)0x0)) {
      iVar3 = ASN1_OCTET_STRING_set(str,auStack_48,uVar2 + uVar1);
      if (iVar3 != 0) {
        return str;
      }
      ipasc_00 = (char *)0x0;
      goto LAB_00327fe2;
    }
    ipasc_00 = (char *)0x0;
  }
  str = (ASN1_OCTET_STRING *)0x0;
LAB_00327fe2:
  OPENSSL_free(ipasc_00);
  ASN1_OCTET_STRING_free(str);
  return (ASN1_OCTET_STRING *)0x0;
}

Assistant:

ASN1_OCTET_STRING *a2i_IPADDRESS_NC(const char *ipasc) {
  ASN1_OCTET_STRING *ret = NULL;
  unsigned char ipout[32];
  char *iptmp = NULL, *p;
  int iplen1, iplen2;
  // FIXME: yes, this function takes a const pointer and writes to it!
  p = const_cast<char *>(strchr(ipasc, '/'));
  if (!p) {
    return NULL;
  }
  iptmp = OPENSSL_strdup(ipasc);
  if (!iptmp) {
    return NULL;
  }
  p = iptmp + (p - ipasc);
  *p++ = 0;

  iplen1 = x509v3_a2i_ipadd(ipout, iptmp);

  if (!iplen1) {
    goto err;
  }

  iplen2 = x509v3_a2i_ipadd(ipout + iplen1, p);

  OPENSSL_free(iptmp);
  iptmp = NULL;

  if (!iplen2 || (iplen1 != iplen2)) {
    goto err;
  }

  ret = ASN1_OCTET_STRING_new();
  if (!ret) {
    goto err;
  }
  if (!ASN1_OCTET_STRING_set(ret, ipout, iplen1 + iplen2)) {
    goto err;
  }

  return ret;

err:
  OPENSSL_free(iptmp);
  ASN1_OCTET_STRING_free(ret);
  return NULL;
}